

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_TimedText.cpp
# Opt level: O0

h__Writer * __thiscall
AS_02::TimedText::MXFWriter::h__Writer::OpenWrite
          (h__Writer *this,string *filename,ui32_t HeaderSize)

{
  bool bVar1;
  int iVar2;
  ILogSink *this_00;
  char *__s;
  TimedTextDescriptor *this_01;
  undefined4 in_ECX;
  undefined4 in_register_00000014;
  h__WriterState local_c8 [31];
  allocator<char> local_49;
  string local_48 [35];
  undefined1 local_25;
  undefined4 local_24;
  undefined8 uStack_20;
  ui32_t HeaderSize_local;
  string *filename_local;
  h__Writer *this_local;
  Result_t *result;
  
  uStack_20 = CONCAT44(in_register_00000014,HeaderSize);
  local_24 = in_ECX;
  filename_local = filename;
  this_local = this;
  bVar1 = ASDCP::MXF::h__WriterState::Test_BEGIN((h__WriterState *)&filename[0x1b].field_2);
  if (bVar1) {
    local_25 = 0;
    __s = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_48,__s,&local_49);
    Kumu::FileWriter::OpenWrite((string *)this);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator(&local_49);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar2) {
      *(undefined4 *)&filename[2]._M_string_length = local_24;
      this_01 = (TimedTextDescriptor *)operator_new(0x278);
      ASDCP::MXF::TimedTextDescriptor::TimedTextDescriptor
                (this_01,(Dictionary *)filename->_M_string_length);
      *(TimedTextDescriptor **)((long)&filename[0x18].field_2 + 8) = this_01;
      ASDCP::MXF::h__WriterState::Goto_INIT(local_c8);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_c8);
      Kumu::Result_t::~Result_t((Result_t *)local_c8);
    }
  }
  else {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (this_00,"RESULT_STATE RETURNED at %s (%d)\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
               ,0x1b6);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::MXFWriter::h__Writer::OpenWrite(const std::string& filename, ui32_t HeaderSize)
{
  if ( ! m_State.Test_BEGIN() )
    {
      KM_RESULT_STATE_HERE();
      return RESULT_STATE;
    }

  Result_t result = m_File.OpenWrite(filename.c_str());

  if ( ASDCP_SUCCESS(result) )
    {
      m_HeaderSize = HeaderSize;
      m_EssenceDescriptor = new ASDCP::MXF::TimedTextDescriptor(m_Dict);
      result = m_State.Goto_INIT();
    }

  return result;
}